

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::EnumNameMember
          (GoGenerator *this,EnumDef *enum_def,EnumVal *ev,size_t max_name_length,string *code_ptr)

{
  string local_50;
  
  std::__cxx11::string::append((char *)code_ptr);
  IdlNamer::EnumVariant_abi_cxx11_(&local_50,&this->namer_,enum_def,ev);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)code_ptr);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_50,(char)max_name_length - (char)(ev->name)._M_string_length);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void EnumNameMember(const EnumDef &enum_def, const EnumVal &ev,
                      size_t max_name_length, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\t";
    code += namer_.EnumVariant(enum_def, ev);
    code += ": ";
    code += std::string(max_name_length - ev.name.length(), ' ');
    code += "\"";
    code += ev.name;
    code += "\",\n";
  }